

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3s.hpp
# Opt level: O2

result_type __thiscall trng::yarn3s::operator()(yarn3s *this)

{
  int32_t iVar1;
  
  step(this);
  iVar1 = (this->S).r[0];
  if (iVar1 != 0) {
    iVar1 = int_math::power<2147462579,_1616076847>::operator()
                      ((power<2147462579,_1616076847> *)g,iVar1);
    return iVar1;
  }
  return 0;
}

Assistant:

TRNG_CUDA_ENABLE
  inline yarn3s::result_type yarn3s::operator()() {
    step();
#if defined TRNG_CUDA
    if (S.r[0] == 0)
      return 0;
    yarn3s::result_type n = S.r[0];
    int64_t p(1), t(gen);
    while (n > 0) {
      if ((n & 0x1) == 0x1)
        p = int_math::modulo<modulus, 1>(p * t);
      t = int_math::modulo<modulus, 1>(t * t);
      n /= 2;
    }
    return static_cast<yarn3s::result_type>(p);
#else
    return S.r[0] == 0 ? 0 : g(S.r[0]);
#endif
  }